

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O0

void __thiscall
JtagAnalyzer::CloseFrame
          (JtagAnalyzer *this,Frame *frm,JtagShiftedData *shifted_data,U64 ending_sample_number,
          JtagShiftedData *corrected_shifted_data)

{
  iterator iVar1;
  iterator iVar2;
  element_type *peVar3;
  JtagShiftedData *corrected_shifted_data_local;
  U64 ending_sample_number_local;
  JtagShiftedData *shifted_data_local;
  Frame *frm_local;
  JtagAnalyzer *this_local;
  
  if ((frm[0x20] == (Frame)0xb) || (frm[0x20] == (Frame)0x4)) {
    if (((frm[0x20] == (Frame)0xb) && ((this->mSettings).mInstructRegBitOrder == LSB_First)) ||
       ((frm[0x20] == (Frame)0x4 && ((this->mSettings).mDataRegBitOrder == LSB_First)))) {
      iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        (&shifted_data->mTdiBits);
      iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        (&shifted_data->mTdiBits);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iVar1._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iVar2._M_current);
      iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        (&shifted_data->mTdoBits);
      iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        (&shifted_data->mTdoBits);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iVar1._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iVar2._M_current);
    }
    peVar3 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
    JtagAnalyzerResults::AddShiftedData(peVar3,shifted_data);
    if (corrected_shifted_data != (JtagShiftedData *)0x0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&corrected_shifted_data->mTdiBits,&shifted_data->mTdiBits);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&corrected_shifted_data->mTdoBits,&shifted_data->mTdoBits);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&shifted_data->mTdiBits);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&shifted_data->mTdoBits);
  }
  *(U64 *)(frm + 8) = ending_sample_number;
  peVar3 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddFrame((Frame *)peVar3);
  return;
}

Assistant:

void JtagAnalyzer::CloseFrame( Frame& frm, JtagShiftedData& shifted_data, U64 ending_sample_number,
                               JtagShiftedData* corrected_shifted_data )
{
    // save the TDI/TDO values in the frame
    if( frm.mType == ShiftIR || frm.mType == ShiftDR )
    {
        // mind the bit order
        if( ( frm.mType == ShiftIR && mSettings.mInstructRegBitOrder == LSB_First ) ||
            ( frm.mType == ShiftDR && mSettings.mDataRegBitOrder == LSB_First ) )
        {
            std::reverse( shifted_data.mTdiBits.begin(), shifted_data.mTdiBits.end() );
            std::reverse( shifted_data.mTdoBits.begin(), shifted_data.mTdoBits.end() );
        }

        mResults->AddShiftedData( shifted_data );

        if( corrected_shifted_data != NULL )
        {
            corrected_shifted_data->mTdiBits = shifted_data.mTdiBits;
            corrected_shifted_data->mTdoBits = shifted_data.mTdoBits;
        }

        shifted_data.mTdiBits.clear();
        shifted_data.mTdoBits.clear();
    }

    frm.mEndingSampleInclusive = ending_sample_number;
    mResults->AddFrame( frm );
}